

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O2

void __thiscall
CppLogger::CppLogger::CppLogger(CppLogger *this,Level t_Level,char *t_Name,bool exitOnFatal)

{
  long lVar1;
  Format *this_00;
  initializer_list<CppLogger::FormatAttribute> t_Format;
  allocator<char> local_3d;
  FormatAttribute local_3c [3];
  
  this->m_Level = t_Level;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_Name,t_Name,&local_3d);
  local_3c[0] = Time;
  local_3c[1] = Name;
  local_3c[2] = 4;
  t_Format._M_len = 3;
  t_Format._M_array = local_3c;
  Format::Format((Format *)&this->field_0x28,t_Format);
  this_00 = (Format *)&this->field_0x40;
  lVar1 = -0x28;
  do {
    Format::Format(this_00,(initializer_list<CppLogger::FormatAttribute>)ZEXT816(0));
    lVar1 = lVar1 + -0x18;
    this_00 = this_00 + 1;
  } while (lVar1 != -0x88);
  this->m_ExitOnFatal = exitOnFatal;
  this->m_TraceStream = (ostream *)&std::cout;
  this->m_InfoStream = (ostream *)&std::cout;
  this->m_WarnStream = (ostream *)&std::cout;
  this->m_ErrorStream = (ostream *)&std::cout;
  this->m_FatalErrorStream = (ostream *)&std::cout;
  std::__cxx11::string::string
            ((string *)&this->m_TraceColor,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Color::white_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&this->m_InfoColor,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Color::green_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&this->m_WarnColor,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Color::yellow_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&this->m_ErrorColor,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Color::red_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&this->m_FatalErrorColor,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Color::red_abi_cxx11_);
  return;
}

Assistant:

CppLogger::CppLogger(Level t_Level, const char* t_Name, bool exitOnFatal)
        :m_Level(t_Level), m_Name(t_Name), m_ExitOnFatal(exitOnFatal) {}